

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void Client::handle_in(Client *self)

{
  pointer pp_Var1;
  ParseStatus PVar2;
  HTTPResponse *this;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  pointer pp_Var3;
  
  self->time_stamp = self->server->time_stamp;
  ReadBuffer::do_read(&(self->request).buffer);
  do {
    PVar2 = HTTPRequest::parse(&self->request);
    if (PVar2 != PARSE_NEW_REQUEST) {
      return;
    }
    pp_Var3 = (self->server->http_request_hook).
              super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pp_Var1 = (self->server->http_request_hook).
              super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pp_Var3 == pp_Var1) goto LAB_00105f09;
      this = (**pp_Var3)(self);
      pp_Var3 = pp_Var3 + 1;
    } while (this == (HTTPResponse *)0x0);
    HTTPResponse::parse(this);
    HTTPResponse::send(this,self->fd,__buf,in_RCX,in_R8D);
    HTTPResponse::~HTTPResponse(this);
    operator_delete(this);
LAB_00105f09:
    HTTPRequest::clean(&self->request);
  } while( true );
}

Assistant:

void Client::handle_in(Client *self) {
    self->time_stamp = self->server->time_stamp;
    self->request.buffer.do_read();
    while (self->request.parse() == PARSE_NEW_REQUEST) {
        for (auto func : self->server->http_request_hook) {
            auto response = func(self);
            if (response != nullptr) {
                response->parse();
                response->send(self->fd);
                delete response;
                break;
            }
        }
        self->request.clean();
    }
}